

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ma.c
# Opt level: O1

Boolean MA_free_heap(Integer memhandle)

{
  Boolean BVar1;
  AD *pAVar2;
  AD *pAVar3;
  _AD **pp_Var4;
  AD *ad;
  AD *local_20;
  
  ma_stats.calls[3] = ma_stats.calls[3] + 1;
  BVar1 = mh2ad(memhandle,&local_20,BL_Heap,"MA_free_heap");
  if (BVar1 == 0) {
    BVar1 = 0;
  }
  else {
    if (ma_trace != 0) {
      printf("MA: freeing \'%s\'\n",local_20->name);
    }
    if (ma_hused == (AD *)0x0) {
LAB_0010c0a3:
      pAVar2 = (AD *)0x0;
    }
    else {
      pAVar2 = ma_hused;
      if (ma_hused == local_20) {
        pAVar3 = (AD *)0x0;
      }
      else {
        do {
          pAVar3 = pAVar2;
          pAVar2 = pAVar3->next;
          if (pAVar2 == (AD *)0x0) goto LAB_0010c0a3;
        } while (pAVar2 != local_20);
      }
      pp_Var4 = &ma_hused;
      if (pAVar3 != (AD *)0x0) {
        pp_Var4 = &pAVar3->next;
      }
      *pp_Var4 = pAVar2->next;
    }
    if (pAVar2 == local_20) {
      ma_stats.hblocks = ma_stats.hblocks - 1;
      ma_stats.hbytes = ma_stats.hbytes - local_20->nbytes;
      block_free_heap(local_20);
      ma_table_deallocate(memhandle);
      BVar1 = 1;
    }
    else {
      BVar1 = 0;
      sprintf(ma_ebuf,"memhandle %ld (name: \'%s\') not on heap used list",memhandle,local_20->name)
      ;
      ma_error(EL_Nonfatal,ET_Internal,"MA_free_heap",ma_ebuf);
    }
  }
  return BVar1;
}

Assistant:

public Boolean MA_free_heap(Integer memhandle) /* the block to deallocate */
{
    AD        *ad;        /* AD for memhandle */

#ifdef STATS
    ma_stats.calls[(int)FID_MA_free_heap]++;
#endif /* STATS */

#ifdef VERIFY
    if (ma_auto_verify && !MA_verify_allocator_stuff())
        return MA_FALSE;
#endif /* VERIFY */

    /* verify memhandle and convert to AD */
    if (!mh2ad(memhandle, &ad, BL_Heap, "MA_free_heap"))
        return MA_FALSE;

    if (ma_trace) 
    (void)printf("MA: freeing '%s'\n", ad->name);

    /* delete block from used list */
    if (list_delete(ad, &ma_hused) != ad)
    {
        (void)sprintf(ma_ebuf,
            "memhandle %ld (name: '%s') not on heap used list",
            (size_t)memhandle, ad->name);
        ma_error(EL_Nonfatal, ET_Internal, "MA_free_heap", ma_ebuf);
        return MA_FALSE;
    }

#ifdef STATS
    ma_stats.hblocks--;
    ma_stats.hbytes -= ad->nbytes;
#endif /* STATS */

    /* reclaim the deallocated block */
    block_free_heap(ad);

    /* free memhandle */
    ma_table_deallocate(memhandle);

    /* success */
    return MA_TRUE;
}